

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_witness_stack_init_alloc(size_t allocation_len,wally_tx_witness_stack **output)

{
  wally_tx_witness_stack *ptr;
  wally_tx_witness_item *pwVar1;
  int iVar2;
  
  if (output == (wally_tx_witness_stack **)0x0) {
    iVar2 = -2;
  }
  else {
    *output = (wally_tx_witness_stack *)0x0;
    ptr = (wally_tx_witness_stack *)wally_calloc(0x18);
    *output = ptr;
    iVar2 = -3;
    if (ptr != (wally_tx_witness_stack *)0x0) {
      if (allocation_len != 0) {
        pwVar1 = (wally_tx_witness_item *)wally_calloc(allocation_len << 4);
        ptr->items = pwVar1;
        if (pwVar1 == (wally_tx_witness_item *)0x0) {
          wally_free(ptr);
          *output = (wally_tx_witness_stack *)0x0;
          return -3;
        }
      }
      ptr->items_allocation_len = allocation_len;
      ptr->num_items = 0;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int wally_tx_witness_stack_init_alloc(size_t allocation_len,
                                      struct wally_tx_witness_stack **output)
{
    struct wally_tx_witness_stack *result;

    TX_CHECK_OUTPUT;
    TX_OUTPUT_ALLOC(struct wally_tx_witness_stack);

    if (allocation_len) {
        result->items = wally_calloc(allocation_len * sizeof(*result->items));
        if (!result->items) {
            wally_free(result);
            *output = NULL;
            return WALLY_ENOMEM;
        }
    }
    result->items_allocation_len = allocation_len;
    result->num_items = 0;
    return WALLY_OK;
}